

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::CommentTemplateToken::CommentTemplateToken
          (CommentTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,string *t)

{
  undefined8 *in_RDI;
  TemplateToken *in_R8;
  Location *in_stack_ffffffffffffffd0;
  Type in_stack_ffffffffffffffdc;
  
  TemplateToken::TemplateToken
            (in_R8,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
             (SpaceHandling)((ulong)in_RDI >> 0x20),(SpaceHandling)in_RDI);
  *in_RDI = &PTR__CommentTemplateToken_0041a820;
  std::__cxx11::string::string((string *)(in_RDI + 6),(string *)in_R8);
  return;
}

Assistant:

CommentTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string& t) : TemplateToken(Type::Comment, loc, pre, post), text(t) {}